

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::javanano::HasMapField(Descriptor *descriptor)

{
  long lVar1;
  Type TVar2;
  Descriptor *pDVar3;
  long lVar4;
  long lVar5;
  
  if (*(int *)(descriptor + 0x2c) < 1) {
    return false;
  }
  lVar5 = 0;
  lVar4 = 0;
  while( true ) {
    lVar1 = *(long *)(descriptor + 0x30);
    TVar2 = FieldDescriptor::type((FieldDescriptor *)(lVar1 + lVar5));
    if (((TVar2 == TYPE_MESSAGE) &&
        (pDVar3 = FieldDescriptor::message_type((FieldDescriptor *)(lVar1 + lVar5)),
        *(char *)(*(long *)(pDVar3 + 0x20) + 0x6b) == '\x01')) &&
       (*(int *)(*(long *)(pDVar3 + 0x10) + 0x8c) == 3)) break;
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0xa8;
    if (*(int *)(descriptor + 0x2c) <= lVar4) {
      return false;
    }
  }
  return true;
}

Assistant:

bool HasMapField(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->type() == FieldDescriptor::TYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      return true;
    }
  }
  return false;
}